

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

void R_SetWindow(int windowSize,int fullWidth,int fullHeight,int stHeight,bool renderingToCanvas)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  TAngle<double> local_30;
  TAngle<double> local_28;
  DAngle fov;
  float trueratio;
  bool renderingToCanvas_local;
  int stHeight_local;
  int fullHeight_local;
  int fullWidth_local;
  int windowSize_local;
  
  freelookviewheight = fullHeight;
  viewwidth = fullWidth;
  viewheight = fullHeight;
  if ((windowSize < 0xb) && (viewheight = stHeight, windowSize != 10)) {
    viewwidth = (setblocks * fullWidth) / 10 & 0xfffffff0;
    viewheight = (setblocks * stHeight) / 10 & 0xfffffff8;
    freelookviewheight = (setblocks * fullHeight) / 10 & 0xfffffff8;
  }
  fov.Degrees._7_1_ = renderingToCanvas;
  if (renderingToCanvas) {
    WidescreenRatio = (float)fullWidth / (float)fullHeight;
    fov.Degrees._0_4_ = WidescreenRatio;
  }
  else {
    WidescreenRatio = ActiveRatio(fullWidth,fullHeight,(float *)&fov);
  }
  DrawFSHUD = windowSize == 0xb;
  R_InitSkyMap();
  centery = viewheight / 2;
  centerx = viewwidth / 2;
  bVar2 = AspectTallerThanWide(WidescreenRatio);
  iVar1 = centerx;
  if (bVar2) {
    centerxwide = centerx;
  }
  else {
    iVar3 = AspectMultiplier(WidescreenRatio);
    centerxwide = (iVar1 * iVar3) / 0x30;
  }
  TAngle<double>::TAngle(&local_28,&FieldOfView);
  if (centerxwide != centerx) {
    dVar4 = (double)centerx;
    dVar5 = TAngle<double>::Radians(&local_28);
    dVar5 = tan(dVar5 / 2.0);
    dVar4 = atan((dVar4 * dVar5) / (double)centerxwide);
    TAngle<double>::ToDegrees(&local_30,dVar4 * 2.0);
    TAngle<double>::operator=(&local_28,&local_30);
    bVar2 = TAngle<double>::operator>(&local_28,170.0);
    if (bVar2) {
      TAngle<double>::operator=(&local_28,170.0);
    }
  }
  dVar4 = TAngle<double>::Radians(&local_28);
  FocalTangent = tan(dVar4 / 2.0);
  (*Renderer->_vptr_FRenderer[0x10])
            ((ulong)(uint)fov.Degrees._0_4_,Renderer,(ulong)(uint)windowSize,(ulong)(uint)fullWidth,
             (ulong)(uint)fullHeight,(ulong)(uint)stHeight);
  return;
}

Assistant:

void R_SetWindow (int windowSize, int fullWidth, int fullHeight, int stHeight, bool renderingToCanvas)
{
	float trueratio;

	if (windowSize >= 11)
	{
		viewwidth = fullWidth;
		freelookviewheight = viewheight = fullHeight;
	}
	else if (windowSize == 10)
	{
		viewwidth = fullWidth;
		viewheight = stHeight;
		freelookviewheight = fullHeight;
	}
	else
	{
		viewwidth = ((setblocks*fullWidth)/10) & (~15);
		viewheight = ((setblocks*stHeight)/10)&~7;
		freelookviewheight = ((setblocks*fullHeight)/10)&~7;
	}

	if (renderingToCanvas)
	{
		WidescreenRatio = fullWidth / (float)fullHeight;
		trueratio = WidescreenRatio;
	}
	else
	{
		WidescreenRatio = ActiveRatio(fullWidth, fullHeight, &trueratio);
	}

	DrawFSHUD = (windowSize == 11);
	
	// [RH] Sky height fix for screens not 200 (or 240) pixels tall
	R_InitSkyMap ();

	centery = viewheight/2;
	centerx = viewwidth/2;
	if (AspectTallerThanWide(WidescreenRatio))
	{
		centerxwide = centerx;
	}
	else
	{
		centerxwide = centerx * AspectMultiplier(WidescreenRatio) / 48;
	}


	DAngle fov = FieldOfView;

	// For widescreen displays, increase the FOV so that the middle part of the
	// screen that would be visible on a 4:3 display has the requested FOV.
	if (centerxwide != centerx)
	{ // centerxwide is what centerx would be if the display was not widescreen
		fov = DAngle::ToDegrees(2 * atan(centerx * tan(fov.Radians()/2) / double(centerxwide)));
		if (fov > 170.) fov = 170.;
	}
	FocalTangent = tan(fov.Radians() / 2);
	Renderer->SetWindow(windowSize, fullWidth, fullHeight, stHeight, trueratio);
}